

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_utils.h
# Opt level: O1

wcharstring * prepare_disk_info_abi_cxx11_(wcharstring *__return_storage_ptr__,Json *json)

{
  pointer pcVar1;
  pointer pcVar2;
  Type TVar3;
  Json *pJVar4;
  ostream *poVar5;
  pointer pcVar6;
  runtime_error *this;
  pointer pcVar7;
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  convert;
  u16string utf16;
  stringstream s;
  undefined1 local_250 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  local_218;
  state_type local_208;
  size_t sStack_200;
  undefined2 local_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  wide_string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  TVar3 = json11::Json::type(json);
  if (TVar3 == NUL) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Json is null");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  pcVar2 = local_250 + 0x10;
  local_250._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"trash_size","");
  pJVar4 = json11::Json::operator[](json,(string *)local_250);
  TVar3 = json11::Json::type(pJVar4);
  if ((pointer)local_250._0_8_ != pcVar2) {
    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
  }
  if (TVar3 != NUL) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Trash size: ",0xc);
    local_250._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"trash_size","");
    pJVar4 = json11::Json::operator[](json,(string *)local_250);
    json11::Json::int_value(pJVar4);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," Mb\n",4);
    if ((pointer)local_250._0_8_ != pcVar2) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
  }
  local_250._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"total_space","");
  pJVar4 = json11::Json::operator[](json,(string *)local_250);
  TVar3 = json11::Json::type(pJVar4);
  if ((pointer)local_250._0_8_ != pcVar2) {
    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
  }
  if (TVar3 != NUL) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Total space: ",0xd);
    local_250._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"total_space","");
    pJVar4 = json11::Json::operator[](json,(string *)local_250);
    json11::Json::int_value(pJVar4);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," Gb\n",4);
    if ((pointer)local_250._0_8_ != pcVar2) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
  }
  local_250._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"used_space","");
  pJVar4 = json11::Json::operator[](json,(string *)local_250);
  TVar3 = json11::Json::type(pJVar4);
  if ((pointer)local_250._0_8_ != pcVar2) {
    operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
  }
  if (TVar3 != NUL) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Used space: ",0xc);
    local_250._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"used_space","");
    pJVar4 = json11::Json::operator[](json,(string *)local_250);
    json11::Json::int_value(pJVar4);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," Mb\n",4);
    if ((pointer)local_250._0_8_ != pcVar2) {
      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
    }
  }
  local_250._0_8_ = operator_new(0x20);
  *(char *)(local_250._0_8_ + 8) = '\0';
  *(char *)(local_250._0_8_ + 9) = '\0';
  *(char *)(local_250._0_8_ + 10) = '\0';
  *(char *)(local_250._0_8_ + 0xb) = '\0';
  *(char **)(local_250._0_8_ + 0x10) = "14_M_get_deleterERKSt9type_info";
  *(char *)(local_250._0_8_ + 0x18) = '\0';
  *(char *)(local_250._0_8_ + 0x19) = '\0';
  *(char *)(local_250._0_8_ + 0x1a) = '\0';
  *(char *)(local_250._0_8_ + 0x1b) = '\0';
  *(undefined ***)local_250._0_8_ = &PTR____codecvt_utf8_base_0016e668;
  local_250._8_8_ = &local_238;
  local_250._16_8_ = 0;
  local_238._M_local_buf[0] = '\0';
  local_228._M_p = (pointer)&local_218;
  local_220 = 0;
  local_218._M_local_buf[0] = L'\0';
  local_208.__count = 0;
  local_208.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  sStack_200 = 0;
  local_1f8._0_1_ = false;
  local_1f8._1_1_ = false;
  std::__cxx11::stringbuf::str();
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::from_bytes(&local_1d0,
               (wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                *)local_250,(char *)local_1f0,(char *)((long)local_1f0 + local_1e8));
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1d0._M_dataplus._M_p == (pointer)0x0) {
    pcVar7 = (pointer)0x2;
  }
  else {
    pcVar6 = local_1d0._M_dataplus._M_p + -1;
    do {
      pcVar7 = pcVar6 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar7;
    } while (*pcVar1 != L'\0');
  }
  std::__cxx11::
  basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>::
  _M_construct<unsigned_short_const*>
            ((basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>
              *)__return_storage_ptr__,local_1d0._M_dataplus._M_p,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity * 2 + 2);
  }
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                      *)local_250);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

wcharstring prepare_disk_info(json11::Json json)
{
    if(json.is_null())
        throw std::runtime_error("Json is null");

    std::stringstream s;
    if(!json["trash_size"].is_null())
        s << "Trash size: " << (unsigned int) json["trash_size"].int_value() / (1024*1024) << " Mb\n";
    if(!json["total_space"].is_null())
        s << "Total space: " << (unsigned int) json["total_space"].int_value() / (1024*1024*1024) << " Gb\n";
    if(!json["used_space"].is_null())
        s << "Used space: " << (unsigned int) json["used_space"].int_value() / (1024*1024) << " Mb\n";

    std::wstring_convert<std::codecvt_utf8<char16_t>, char16_t> convert;
    std::u16string utf16 = convert.from_bytes(s.str());

    return wcharstring((WCHAR*)utf16.data());
}